

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase333::run(TestCase333 *this)

{
  StructSchema SVar1;
  StructSchema SVar2;
  Schema SVar3;
  Type TVar4;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  Field basic;
  StructSchema branded;
  Field foo;
  StructSchema unbound;
  StructSchema inner2;
  anon_union_8_2_eba6ea51_for_Type_5 local_a8;
  StructSchema instance2;
  StructSchema schema;
  SchemaLoader loader;
  StructSchema results;
  Field foo2;
  StructSchema bound_1;
  
  foo._8_8_ = foo.parent.super_Schema.raw;
  foo2._8_8_ = foo2.parent.super_Schema.raw;
  SchemaLoader::SchemaLoader(&loader);
  foo2.parent.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto((Reader *)&basic,(Schema *)&foo2);
  foo.parent.super_Schema = SchemaLoader::load(&loader,(Reader *)&basic);
  SVar1 = Schema::asStruct((Schema *)&foo);
  foo2.parent.super_Schema.raw = (Schema)((long)schemas::s_e3da5a2ccd28c0d8 + 0x48);
  Schema::getProto((Reader *)&basic,(Schema *)&foo2);
  foo.parent.super_Schema = SchemaLoader::load(&loader,(Reader *)&basic);
  SVar2 = Schema::asStruct((Schema *)&foo);
  foo.parent.super_Schema.raw = (Schema)((long)schemas::s_f6a841117e19ac73 + 0x48);
  Schema::getProto((Reader *)&basic,(Schema *)&foo);
  SchemaLoader::load(&loader,(Reader *)&basic);
  foo.parent.super_Schema.raw = (Schema)((long)schemas::s_a9ab42b118d6d435 + 0x48);
  Schema::getProto((Reader *)&basic,(Schema *)&foo);
  SchemaLoader::load(&loader,(Reader *)&basic);
  foo.parent.super_Schema.raw = (Schema)((long)schemas::s_c9e749e8dd54da5c + 0x48);
  Schema::getProto((Reader *)&basic,(Schema *)&foo);
  SchemaLoader::load(&loader,(Reader *)&basic);
  foo.parent.super_Schema.raw = (Schema)((long)schemas::s_a5b46224e33581ad + 0x48);
  Schema::getProto((Reader *)&basic,(Schema *)&foo);
  SchemaLoader::load(&loader,(Reader *)&basic);
  foo.parent.super_Schema.raw = (Schema)((long)schemas::s_9d5b8cd8de9922eb + 0x48);
  Schema::getProto((Reader *)&basic,(Schema *)&foo);
  SchemaLoader::load(&loader,(Reader *)&basic);
  foo2.parent.super_Schema.raw = (Schema)0x664dc0;
  Schema::getProto((Reader *)&basic,(Schema *)&foo2);
  foo.parent.super_Schema = SchemaLoader::load(&loader,(Reader *)&basic);
  schema = Schema::asStruct((Schema *)&foo);
  branded.super_Schema.raw = (Schema)((long)NULL_STRUCT_SCHEMA + 0x48);
  name.content.size_ = 6;
  name.content.ptr = "basic";
  StructSchema::getFieldByName(&basic,&schema,name);
  foo._0_16_ = StructSchema::Field::getType(&basic);
  branded = Type::asStruct((Type *)&foo);
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  StructSchema::getFieldByName(&foo,&branded,name_00);
  foo2._0_16_ = StructSchema::Field::getType(&foo);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)&foo2);
  if (((Schema)SVar3.raw != SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x160,ERROR,"\"failed: expected \" \"foo.getType().asStruct() == allTypes\"",
               (char (*) [54])"failed: expected foo.getType().asStruct() == allTypes");
  }
  foo2._0_16_ = StructSchema::Field::getType(&foo);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)&foo2);
  if (((Schema)SVar3.raw == SVar2.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x161,ERROR,"\"failed: expected \" \"foo.getType().asStruct() != tap\"",
               (char (*) [49])"failed: expected foo.getType().asStruct() != tap");
  }
  name_01.content.size_ = 4;
  name_01.content.ptr = "rev";
  StructSchema::getFieldByName(&foo2,&branded,name_01);
  _inner2 = StructSchema::Field::getType(&foo2);
  instance2 = Type::asStruct((Type *)&inner2);
  name_02.content.size_ = 4;
  name_02.content.ptr = "foo";
  StructSchema::getFieldByName(&foo2,&instance2,name_02);
  _inner2 = StructSchema::Field::getType(&foo2);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)&inner2);
  if (((Schema)SVar3.raw != SVar2.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x165,ERROR,"\"failed: expected \" \"foo2.getType().asStruct() == tap\"",
               (char (*) [50])"failed: expected foo2.getType().asStruct() == tap");
  }
  _inner2 = StructSchema::Field::getType(&foo2);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)&inner2);
  if (((Schema)SVar3.raw == SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x166,ERROR,"\"failed: expected \" \"foo2.getType().asStruct() != allTypes\"",
               (char (*) [55])"failed: expected foo2.getType().asStruct() != allTypes");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "inner2";
  StructSchema::getFieldByName(&basic,&schema,name_03);
  foo._0_16_ = StructSchema::Field::getType(&basic);
  SVar2 = Type::asStruct((Type *)&foo);
  inner2.super_Schema.raw = SVar2.super_Schema.raw;
  name_04.content.size_ = 0xb;
  name_04.content.ptr = "innerBound";
  StructSchema::getFieldByName(&basic,&inner2,name_04);
  foo._0_16_ = StructSchema::Field::getType(&basic);
  instance2 = Type::asStruct((Type *)&foo);
  name_05.content.size_ = 4;
  name_05.content.ptr = "foo";
  StructSchema::getFieldByName(&basic,&instance2,name_05);
  foo._0_16_ = StructSchema::Field::getType(&basic);
  if ((((uint)foo.parent.super_Schema.raw & 0xffffff) == 0x12) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x16e,ERROR,"\"failed: expected \" \"!(boundFoo.isAnyPointer())\"",
               (char (*) [44])"failed: expected !(boundFoo.isAnyPointer())");
  }
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)&foo);
  if (((Schema)SVar3.raw != SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x16f,ERROR,"\"failed: expected \" \"boundFoo.asStruct() == allTypes\"",
               (char (*) [49])"failed: expected boundFoo.asStruct() == allTypes");
  }
  name_06.content.size_ = 0xd;
  name_06.content.ptr = "innerUnbound";
  StructSchema::getFieldByName(&basic,&inner2,name_06);
  foo2._0_16_ = StructSchema::Field::getType(&basic);
  unbound = Type::asStruct((Type *)&foo2);
  name_07.content.size_ = 4;
  name_07.content.ptr = "foo";
  StructSchema::getFieldByName(&basic,&unbound,name_07);
  TVar4 = StructSchema::Field::getType(&basic);
  if (((TVar4._0_4_ & 0xffffff) != 0x12) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x173,ERROR,"\"failed: expected \" \"unboundFoo.isAnyPointer()\"",
               (char (*) [43])"failed: expected unboundFoo.isAnyPointer()");
  }
  name_08.content.size_ = 0xb;
  name_08.content.ptr = "genericCap";
  StructSchema::getFieldByName(&basic,&schema,name_08);
  foo._0_16_ = StructSchema::Field::getType(&basic);
  instance2.super_Schema.raw = (Schema)Type::asInterface((Type *)&foo);
  name_09.content.size_ = 5;
  name_09.content.ptr = "call";
  InterfaceSchema::getMethodByName((Method *)&basic,(InterfaceSchema *)&instance2,name_09);
  unbound = InterfaceSchema::Method::getParamType((Method *)&basic);
  name_10.content.size_ = 0xb;
  name_10.content.ptr = "innerBound";
  StructSchema::getFieldByName(&foo,&unbound,name_10);
  foo2._0_16_ = StructSchema::Field::getType(&foo);
  bound_1 = Type::asStruct((Type *)&foo2);
  name_11.content.size_ = 4;
  name_11.content.ptr = "foo";
  StructSchema::getFieldByName(&foo,&bound_1,name_11);
  foo2._0_16_ = StructSchema::Field::getType(&foo);
  if ((((uint)foo2.parent.super_Schema.raw & 0xffffff) == 0x12) && (kj::_::Debug::minSeverity < 3))
  {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x17d,ERROR,"\"failed: expected \" \"!(boundFoo.isAnyPointer())\"",
               (char (*) [44])"failed: expected !(boundFoo.isAnyPointer())");
  }
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)&foo2);
  if (((Schema)SVar3.raw != SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x17e,ERROR,"\"failed: expected \" \"boundFoo.asStruct() == allTypes\"",
               (char (*) [49])"failed: expected boundFoo.asStruct() == allTypes");
  }
  name_12.content.size_ = 4;
  name_12.content.ptr = "baz";
  StructSchema::getFieldByName(&foo,&unbound,name_12);
  TVar4 = StructSchema::Field::getType(&foo);
  if (((TVar4._0_4_ & 0xffffff) != 0xc) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x17f,ERROR,
               "\"failed: expected \" \"inner2.getFieldByName(\\\"baz\\\").getType().isText()\"",
               (char (*) [65])"failed: expected inner2.getFieldByName(\"baz\").getType().isText()");
  }
  results = InterfaceSchema::Method::getResultType((Method *)&basic);
  name_13.content.size_ = 4;
  name_13.content.ptr = "qux";
  StructSchema::getFieldByName(&foo,&results,name_13);
  TVar4 = StructSchema::Field::getType(&foo);
  if (((TVar4._0_4_ & 0xffffff) != 0xd) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x182,ERROR,
               "\"failed: expected \" \"results.getFieldByName(\\\"qux\\\").getType().isData()\"",
               (char (*) [66])"failed: expected results.getFieldByName(\"qux\").getType().isData()")
    ;
  }
  name_14.content.size_ = 4;
  name_14.content.ptr = "gen";
  StructSchema::getFieldByName(&foo,&results,name_14);
  _inner2 = StructSchema::Field::getType(&foo);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)&inner2);
  if (((Schema)SVar3.raw != branded.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[79]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x184,ERROR,
               "\"failed: expected \" \"results.getFieldByName(\\\"gen\\\").getType().asStruct() == branded\""
               ,(char (*) [79])
                "failed: expected results.getFieldByName(\"gen\").getType().asStruct() == branded");
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Generics) {
  SchemaLoader loader;

  StructSchema allTypes = loader.load(Schema::from<TestAllTypes>().getProto()).asStruct();
  StructSchema tap = loader.load(Schema::from<test::TestAnyPointer>().getProto()).asStruct();
  loader.load(Schema::from<test::TestGenerics<>::Inner>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Inner2<>>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Interface<>>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Interface<>::CallResults>().getProto());
  loader.load(Schema::from<test::TestGenerics<>>().getProto());
  StructSchema schema = loader.load(Schema::from<test::TestUseGenerics>().getProto()).asStruct();

  StructSchema branded;

  {
    StructSchema::Field basic = schema.getFieldByName("basic");
    branded = basic.getType().asStruct();

    StructSchema::Field foo = branded.getFieldByName("foo");
    EXPECT_TRUE(foo.getType().asStruct() == allTypes);
    EXPECT_TRUE(foo.getType().asStruct() != tap);

    StructSchema instance2 = branded.getFieldByName("rev").getType().asStruct();
    StructSchema::Field foo2 = instance2.getFieldByName("foo");
    EXPECT_TRUE(foo2.getType().asStruct() == tap);
    EXPECT_TRUE(foo2.getType().asStruct() != allTypes);
  }

  {
    StructSchema inner2 = schema.getFieldByName("inner2").getType().asStruct();

    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);

    StructSchema unbound = inner2.getFieldByName("innerUnbound").getType().asStruct();
    Type unboundFoo = unbound.getFieldByName("foo").getType();
    EXPECT_TRUE(unboundFoo.isAnyPointer());
  }

  {
    InterfaceSchema cap = schema.getFieldByName("genericCap").getType().asInterface();
    InterfaceSchema::Method method = cap.getMethodByName("call");

    StructSchema inner2 = method.getParamType();
    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);
    EXPECT_TRUE(inner2.getFieldByName("baz").getType().isText());

    StructSchema results = method.getResultType();
    EXPECT_TRUE(results.getFieldByName("qux").getType().isData());

    EXPECT_TRUE(results.getFieldByName("gen").getType().asStruct() == branded);
  }
}